

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_test.c
# Opt level: O3

void test_wait_n(testing t)

{
  nsync_counter pnVar1;
  _func_void_void_ptr *p_Var2;
  testing t_00;
  uint uVar3;
  nsync_counter pnVar4;
  closure *pcVar5;
  nsync_note pnVar6;
  nsync_note pnVar7;
  char *pcVar8;
  long lVar9;
  code *pcVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  bool bVar16;
  nsync_time nVar17;
  nsync_time nVar18;
  nsync_time abs_deadline;
  nsync_time abs_deadline_00;
  nsync_time abs_deadline_01;
  nsync_time abs_deadline_02;
  nsync_time abs_deadline_03;
  nsync_waitable_s **in_stack_ffffffffffffff80;
  undefined8 local_78;
  void *pvStack_70;
  undefined8 local_68;
  void *pvStack_60;
  nsync_counter local_58;
  _func_void_void_ptr *local_50;
  nsync_note local_48;
  int local_3c;
  testing local_38;
  
  local_3c = 0;
  local_38 = t;
  do {
    local_58 = nsync::nsync_counter_new(0);
    local_78._0_4_ = 0;
    local_78._4_4_ = 0;
    pvStack_70 = (void *)0x0;
    local_68._0_4_ = 0;
    local_68._4_4_ = 0;
    pvStack_60 = (void *)0x0;
    nVar17 = nsync::nsync_time_now();
    nVar18 = nsync::nsync_time_ms(100);
    nVar17 = nsync::nsync_time_add(nVar17,nVar18);
    iVar14 = (uint)local_78 + 10;
    do {
      local_50 = (_func_void_void_ptr *)nVar17.tv_nsec;
      local_48 = (nsync_note)nVar17.tv_sec;
      pnVar4 = nsync::nsync_counter_new(0);
      a_ensure_(&local_78,1,0x10);
      lVar9 = (long)(int)(uint)local_78;
      local_78._0_4_ = (uint)local_78 + 1;
      pcVar10 = (code *)(lVar9 * 0x10);
      *(nsync_counter *)((long)pvStack_70 + (long)pcVar10) = pnVar4;
      *(undefined1 **)(pcVar10 + (long)pvStack_70 + 8) = nsync::nsync_counter_waitable_funcs;
      if ((int)(uint)local_78 < iVar14) {
        iVar12 = 3;
        do {
          nsync::nsync_counter_add(pnVar4,1);
          pnVar1 = local_58;
          nsync::nsync_counter_add(local_58,1);
          pcVar5 = (closure *)malloc(0x30);
          pcVar5->f0 = closure_f0_decrement;
          pcVar5[1].f0 = decrement_at;
          pcVar5[2].f0 = (_func_void_void_ptr *)pnVar4;
          pcVar5[3].f0 = (_func_void_void_ptr *)local_48;
          pcVar5[4].f0 = local_50;
          pcVar5[5].f0 = (_func_void_void_ptr *)pnVar1;
          pcVar10 = local_50;
          closure_fork(pcVar5);
          bVar16 = iVar12 == 0;
          iVar12 = iVar12 + -1;
          if (bVar16) break;
        } while ((int)(uint)local_78 < iVar14);
      }
      nVar17.tv_nsec = (__syscall_slong_t)local_50;
      nVar17.tv_sec = (__time_t)local_48;
    } while ((int)(uint)local_78 < iVar14);
    iVar14 = (uint)local_78 + 10;
    do {
      nVar18.tv_nsec = (__syscall_slong_t)pcVar10;
      nVar18.tv_sec = 999999999;
      pnVar6 = nsync::nsync_note_new((nsync *)0x0,(nsync_note)0x7fffffffffffffff,nVar18);
      a_ensure_(&local_78,1,0x10);
      pnVar4 = local_58;
      lVar9 = (long)(int)(uint)local_78;
      local_78._0_4_ = (uint)local_78 + 1;
      *(nsync_note *)((long)pvStack_70 + lVar9 * 0x10) = pnVar6;
      *(undefined ***)((long)pvStack_70 + lVar9 * 0x10 + 8) = &nsync::nsync_note_waitable_funcs;
      nsync::nsync_counter_add(local_58,1);
      pcVar5 = (closure *)malloc(0x30);
      pcVar5->f0 = closure_f0_notify;
      pcVar5[1].f0 = notify_at;
      pcVar5[2].f0 = (_func_void_void_ptr *)pnVar6;
      pcVar5[3].f0 = (_func_void_void_ptr *)local_48;
      pcVar5[4].f0 = local_50;
      pcVar5[5].f0 = (_func_void_void_ptr *)pnVar4;
      pcVar10 = local_50;
      closure_fork(pcVar5);
      if ((int)(uint)local_78 < iVar14) {
        iVar12 = 3;
        do {
          abs_deadline.tv_nsec = (__syscall_slong_t)pcVar10;
          abs_deadline.tv_sec = 999999999;
          pnVar7 = nsync::nsync_note_new
                             ((nsync *)pnVar6,(nsync_note)0x7fffffffffffffff,abs_deadline);
          a_ensure_(&local_78,1,0x10);
          lVar9 = (long)(int)(uint)local_78;
          local_78._0_4_ = (uint)local_78 + 1;
          pcVar10 = (code *)(lVar9 * 0x10);
          *(nsync_note *)((long)pvStack_70 + (long)pcVar10) = pnVar7;
          *(undefined ***)(pcVar10 + (long)pvStack_70 + 8) = &nsync::nsync_note_waitable_funcs;
          bVar16 = iVar12 == 0;
          iVar12 = iVar12 + -1;
          if (bVar16) break;
        } while ((int)(uint)local_78 < iVar14);
      }
    } while ((int)(uint)local_78 < iVar14);
    iVar14 = (uint)local_78 + 10;
    do {
      pnVar6 = local_48;
      p_Var2 = local_50;
      abs_deadline_00.tv_nsec = (__syscall_slong_t)pcVar10;
      abs_deadline_00.tv_sec = (__time_t)local_50;
      pnVar7 = nsync::nsync_note_new((nsync *)0x0,local_48,abs_deadline_00);
      a_ensure_(&local_78,1,0x10);
      pnVar4 = local_58;
      lVar9 = (long)(int)(uint)local_78;
      local_78._0_4_ = (uint)local_78 + 1;
      *(nsync_note *)((long)pvStack_70 + lVar9 * 0x10) = pnVar7;
      *(undefined ***)((long)pvStack_70 + lVar9 * 0x10 + 8) = &nsync::nsync_note_waitable_funcs;
      nsync::nsync_counter_add(local_58,1);
      pcVar5 = (closure *)malloc(0x30);
      pcVar5->f0 = closure_f0_notify;
      pcVar10 = notify_at;
      pcVar5[1].f0 = notify_at;
      pcVar5[2].f0 = (_func_void_void_ptr *)pnVar7;
      pcVar5[3].f0 = (_func_void_void_ptr *)pnVar6;
      pcVar5[4].f0 = p_Var2;
      pcVar5[5].f0 = (_func_void_void_ptr *)pnVar4;
      closure_fork(pcVar5);
      if ((int)(uint)local_78 < iVar14) {
        iVar12 = 3;
        do {
          abs_deadline_01.tv_nsec = (__syscall_slong_t)pcVar10;
          abs_deadline_01.tv_sec = 999999999;
          pnVar6 = nsync::nsync_note_new
                             ((nsync *)pnVar7,(nsync_note)0x7fffffffffffffff,abs_deadline_01);
          a_ensure_(&local_78,1,0x10);
          lVar9 = (long)(int)(uint)local_78;
          local_78._0_4_ = (uint)local_78 + 1;
          pcVar10 = (code *)(lVar9 * 0x10);
          *(nsync_note *)((long)pvStack_70 + (long)pcVar10) = pnVar6;
          *(undefined ***)(pcVar10 + (long)pvStack_70 + 8) = &nsync::nsync_note_waitable_funcs;
          bVar16 = iVar12 == 0;
          iVar12 = iVar12 + -1;
          if (bVar16) break;
        } while ((int)(uint)local_78 < iVar14);
      }
      t_00 = local_38;
    } while ((int)(uint)local_78 < iVar14);
    if ((uint)local_78 == 0x1e) {
LAB_001047a3:
      lVar11 = 0;
      uVar13 = 0;
      do {
        lVar15 = (long)pvStack_70 + lVar11;
        a_ensure_(&local_68,1,8);
        lVar9 = (long)(int)(uint)local_68;
        local_68._0_4_ = (uint)local_68 + 1;
        *(long *)((long)pvStack_60 + lVar9 * 8) = lVar15;
        uVar13 = uVar13 + 1;
        lVar11 = lVar11 + 0x10;
      } while (uVar13 != (uint)local_78);
    }
    else {
      pcVar8 = smprintf("array length not equal to number of counters");
      lVar9 = 0x66;
      testing_error_(t_00,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O3/cpp/testing/wait_test.c"
                     ,0x66,pcVar8);
      if ((uint)local_78 != 0) goto LAB_001047a3;
    }
    while ((uint)local_68 != 0) {
      abs_deadline_03.tv_nsec = (ulong)(uint)local_68;
      abs_deadline_03.tv_sec = 999999999;
      uVar3 = nsync::nsync_wait_n((nsync *)0x0,(void *)0x0,(_func_void_void_ptr *)0x0,
                                  (_func_void_void_ptr *)0x7fffffffffffffff,abs_deadline_03,
                                  (int)pvStack_60,in_stack_ffffffffffffff80);
      if (uVar3 == (uint)local_68) {
        pcVar8 = smprintf("nsync_wait_n returned with no waiter ready");
        testing_error_(t_00,1,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O3/cpp/testing/wait_test.c"
                       ,0x6f,pcVar8);
      }
      lVar9 = (long)(int)(uint)local_68;
      *(undefined8 *)((long)pvStack_60 + (long)(int)uVar3 * 8) =
           *(undefined8 *)((long)pvStack_60 + lVar9 * 8 + -8);
      if ((int)(uint)local_68 < 1) {
        _DAT_00000000 = 0;
      }
      else {
        local_68._0_4_ = (uint)local_68 - 1;
      }
    }
    abs_deadline_02.tv_nsec = lVar9;
    abs_deadline_02.tv_sec = 999999999;
    nsync::nsync_counter_wait((nsync *)local_58,(nsync_counter)0x7fffffffffffffff,abs_deadline_02);
    lVar9 = 0;
    do {
      nsync::nsync_counter_free(*(nsync_counter *)((long)pvStack_70 + lVar9));
      lVar9 = lVar9 + 0x10;
    } while (lVar9 != 0xa0);
    if (10 < (int)(uint)local_78) {
      lVar9 = 10;
      lVar11 = 0xa0;
      do {
        nsync::nsync_note_free(*(nsync_note *)((long)pvStack_70 + lVar11));
        lVar9 = lVar9 + 1;
        lVar11 = lVar11 + 0x10;
      } while (lVar9 < (int)(uint)local_78);
    }
    if (0 < local_68._4_4_) {
      free(pvStack_60);
    }
    iVar14 = local_3c;
    local_68 = 0;
    pvStack_60 = (void *)0x0;
    if (0 < local_78._4_4_) {
      free(pvStack_70);
    }
    local_78 = 0;
    pvStack_70 = (void *)0x0;
    nsync::nsync_counter_free(local_58);
    local_3c = iVar14 + 1;
    if (local_3c == 0x1e) {
      return;
    }
  } while( true );
}

Assistant:

static void test_wait_n (testing t) {
	int i;
	int j;
	int k;
	int ncounter = 10;
	int nnote = 10;
	int nnote_expire = 10;
	for (i = 0; i != 30; i++) {
		nsync_counter done = nsync_counter_new (0);
		nsync_time now;
		nsync_time deadline;
		a_waitable aw;
		a_pwaitable apw;
		memset (&aw, 0, sizeof (aw));
		memset (&apw, 0, sizeof (apw));
		now = nsync_time_now ();
		deadline = nsync_time_add (now, nsync_time_ms (100));
		for (j = A_LEN (&aw); A_LEN (&aw) < j+ncounter;) {
			nsync_counter c = nsync_counter_new (0);
			struct nsync_waitable_s *w = &A_PUSH (&aw);
			w->v = c;
			w->funcs = &nsync_counter_waitable_funcs;
			for (k = 0; k != 4 && A_LEN (&aw) < j+ncounter; k++) {
				nsync_counter_add (c, 1);
				nsync_counter_add (done, 1);
				closure_fork (closure_decrement (&decrement_at, c, deadline, done));
			}
		}
		for (j = A_LEN (&aw); A_LEN (&aw) < j+nnote;) {
			nsync_note n = nsync_note_new (NULL, nsync_time_no_deadline);
			struct nsync_waitable_s *w = &A_PUSH (&aw);
			w->v = n;
			w->funcs = &nsync_note_waitable_funcs;
			nsync_counter_add (done, 1);
			closure_fork (closure_notify (&notify_at, n, deadline, done));
			for (k = 0; k != 4 && A_LEN (&aw) < j+nnote; k++) {
				nsync_note cn = nsync_note_new (n, nsync_time_no_deadline);
				struct nsync_waitable_s *lw = &A_PUSH (&aw);
				lw->v = cn;
				lw->funcs = &nsync_note_waitable_funcs;
			}
		}
		for (j = A_LEN (&aw); A_LEN (&aw) < j+nnote_expire;) {
			nsync_note n = nsync_note_new (NULL, deadline);
			struct nsync_waitable_s *w = &A_PUSH (&aw);
			w->v = n;
			w->funcs = &nsync_note_waitable_funcs;
			nsync_counter_add (done, 1);
			closure_fork (closure_notify (&notify_at, n, deadline, done));
			for (k = 0; k != 4 && A_LEN (&aw) < j+nnote; k++) {
				nsync_note cn = nsync_note_new (n, nsync_time_no_deadline);
				struct nsync_waitable_s *lw = &A_PUSH (&aw);
				lw->v = cn;
				lw->funcs = &nsync_note_waitable_funcs;
			}
		}
		if (ncounter + nnote + nnote_expire != A_LEN (&aw)) {
			TEST_ERROR (t, ("array length not equal to number of counters"));
		}
		for (j = 0; j != A_LEN (&aw); j++) {
			A_PUSH (&apw) = &A (&aw, j);
		}
		while (A_LEN (&apw) != 0) {
			k = nsync_wait_n (NULL, NULL, NULL, nsync_time_no_deadline,
					  A_LEN (&apw), &A (&apw, 0));
			if (k == A_LEN (&apw)) {
				TEST_ERROR (t, ("nsync_wait_n returned with no waiter ready"));
			}
			A (&apw, k) = A (&apw, A_LEN (&apw) - 1);
			A_DISCARD (&apw, 1);
		}
		nsync_counter_wait (done, nsync_time_no_deadline);
		for (k = 0; k != ncounter; k++) {
			nsync_counter_free ((nsync_counter) A (&aw, k).v);
		}
		for (; k < A_LEN (&aw); k++) {
			nsync_note_free ((nsync_note) A (&aw, k).v);
		}
		A_FREE (&apw);
		A_FREE (&aw);
		nsync_counter_free (done);
	}
}